

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O1

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::InstrumentPass::EndFunction(InstrumentPass *this)

{
  IRContext *this_00;
  long in_RSI;
  int local_3c [3];
  IRContext *local_30;
  initializer_list<spvtools::opt::Operand> local_28;
  
  local_30 = *(IRContext **)(in_RSI + 0x28);
  local_3c[2] = 0x38;
  local_3c[1] = 0;
  local_3c[0] = 0;
  local_28._M_array = (iterator)0x0;
  local_28._M_len = 0;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)this,&local_30,(Op *)(local_3c + 2),local_3c + 1,local_3c,&local_28);
  this_00 = *(IRContext **)(in_RSI + 0x28);
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  analysis::DefUseManager::AnalyzeInstDefUse
            ((this_00->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
             (Instruction *)(this->super_Pass)._vptr_Pass);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Instruction> InstrumentPass::EndFunction() {
  auto end = MakeUnique<Instruction>(context(), spv::Op::OpFunctionEnd, 0, 0,
                                     std::initializer_list<Operand>{});
  get_def_use_mgr()->AnalyzeInstDefUse(end.get());
  return end;
}